

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,uchar *ptr,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  char buf [3];
  char local_3b [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (n != 0) {
    uVar1 = 0;
    uVar2 = 1;
    do {
      sprintf(local_3b,"%02x",(ulong)ptr[uVar1]);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar3 = uVar2 < n;
      uVar1 = uVar2;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(unsigned char *ptr,size_t n)
{
	std::string res;
	for(unsigned i=0;i<n;i++) {
		char buf[3];
		sprintf(buf,"%02x",ptr[i]);
		res+=buf;
	}
	return res;
}